

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-type.cpp
# Opt level: O1

Up __thiscall yactfr::FixedLengthUnsignedIntegerType::_clone(FixedLengthUnsignedIntegerType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  undefined1 local_50 [8];
  _Rb_tree_node_base local_48;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_28;
  
  local_48._M_right._4_4_ = *(undefined4 *)(in_RSI + 0xc);
  local_48._M_right._0_4_ = *(undefined4 *)(in_RSI + 0x18);
  local_48._M_left._4_4_ = *(undefined4 *)(in_RSI + 0x1c);
  local_48._M_left._0_4_ = *(undefined4 *)(in_RSI + 0x20);
  local_48._M_parent._4_4_ = *(undefined4 *)(in_RSI + 0x28);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    local_50 = (undefined1  [8])0x0;
  }
  else {
    MapItem::clone((MapItem *)(local_50 + 0x28),*(__fn **)(in_RSI + 0x10),in_RDX,in_ECX,in_R8);
    local_50 = (undefined1  [8])local_28._M_head_impl;
    local_28._M_head_impl = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               (local_50 + 0x28));
  }
  std::
  make_unique<yactfr::FixedLengthUnsignedIntegerType_const,unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,yactfr::DisplayBase,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,std::set<yactfr::UnsignedIntegerTypeRole,std::less<yactfr::UnsignedIntegerTypeRole>,std::allocator<yactfr::UnsignedIntegerTypeRole>>const&>
            ((uint *)(local_50 + 8),(uint *)(local_50 + 0x24),(ByteOrder *)(local_50 + 0x20),
             (BitOrder *)(local_50 + 0x1c),(DisplayBase *)(local_50 + 0x18),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              *)(local_50 + 0x14),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (in_RSI + 0x30),
             (set<yactfr::UnsignedIntegerTypeRole,_std::less<yactfr::UnsignedIntegerTypeRole>,_std::allocator<yactfr::UnsignedIntegerTypeRole>_>
              *)local_50);
  (this->super_FixedLengthIntegerType<unsigned_long_long>).super_FixedLengthBitArrayType.
  super_ScalarDataType.super_DataType._vptr_DataType = (_func_int **)local_48._0_8_;
  local_48._M_color = _S_red;
  local_48._4_4_ = 0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_50);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthUnsignedIntegerType::_clone() const
{
    return FixedLengthUnsignedIntegerType::create(this->alignment(), this->length(),
                                                  this->byteOrder(), this->bitOrder(),
                                                  this->preferredDisplayBase(), this->mappings(),
                                                  internal::tryCloneAttrs(this->attributes()),
                                                  this->roles());
}